

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

Action __thiscall
psy::C::TypeChecker::visitPredefinedName(TypeChecker *this,PredefinedNameSyntax *node)

{
  SemanticModel *pSVar1;
  SyntaxKind SVar2;
  QualifiedType *this_00;
  pointer this_01;
  ArrayType *this_02;
  Compilation *pCVar3;
  Type *pTVar4;
  ostream *poVar5;
  unique_ptr<psy::C::ArrayType,_std::default_delete<psy::C::ArrayType>_> local_98;
  unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_> local_90;
  unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_> local_88;
  Type *local_80;
  Type *ty;
  unique_ptr<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_> qualTy;
  BasicType *charTy;
  SyntaxToken local_58;
  PredefinedNameSyntax *local_20;
  PredefinedNameSyntax *node_local;
  TypeChecker *this_local;
  
  local_20 = node;
  node_local = (PredefinedNameSyntax *)this;
  PredefinedNameSyntax::identifierToken(&local_58,node);
  SVar2 = SyntaxToken::kind(&local_58);
  SyntaxToken::~SyntaxToken(&local_58);
  if ((SVar2 == Keyword___func__) || ((ushort)(SVar2 - Keyword_ExtGNU___FUNCTION__) < 2)) {
    pCVar3 = SemanticModel::compilation(this->semaModel_);
    qualTy._M_t.
    super___uniq_ptr_impl<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_>._M_t.
    super__Tuple_impl<0UL,_psy::C::QualifiedType_*,_std::default_delete<psy::C::QualifiedType>_>.
    super__Head_base<0UL,_psy::C::QualifiedType_*,_false>._M_head_impl =
         (__uniq_ptr_data<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>,_true,_true>
          )Compilation::canonicalBasicType(pCVar3,Char);
    this_00 = (QualifiedType *)operator_new(0x10);
    QualifiedType::QualifiedType
              (this_00,(Type *)qualTy._M_t.
                               super___uniq_ptr_impl<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_psy::C::QualifiedType_*,_std::default_delete<psy::C::QualifiedType>_>
                               .super__Head_base<0UL,_psy::C::QualifiedType_*,_false>._M_head_impl);
    std::unique_ptr<psy::C::QualifiedType,std::default_delete<psy::C::QualifiedType>>::
    unique_ptr<std::default_delete<psy::C::QualifiedType>,void>
              ((unique_ptr<psy::C::QualifiedType,std::default_delete<psy::C::QualifiedType>> *)&ty,
               this_00);
    this_01 = std::unique_ptr<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_>::
              operator->((unique_ptr<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_>
                          *)&ty);
    QualifiedType::qualifyWithConst(this_01);
    pSVar1 = this->semaModel_;
    std::unique_ptr<psy::C::Type,std::default_delete<psy::C::Type>>::
    unique_ptr<psy::C::QualifiedType,std::default_delete<psy::C::QualifiedType>,void>
              ((unique_ptr<psy::C::Type,std::default_delete<psy::C::Type>> *)&local_88,
               (unique_ptr<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_> *)&ty
              );
    pTVar4 = SemanticModel::keepType(pSVar1,&local_88);
    std::unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_>::~unique_ptr(&local_88);
    pSVar1 = this->semaModel_;
    local_80 = pTVar4;
    this_02 = (ArrayType *)operator_new(0x10);
    ArrayType::ArrayType(this_02,local_80);
    std::unique_ptr<psy::C::ArrayType,std::default_delete<psy::C::ArrayType>>::
    unique_ptr<std::default_delete<psy::C::ArrayType>,void>
              ((unique_ptr<psy::C::ArrayType,std::default_delete<psy::C::ArrayType>> *)&local_98,
               this_02);
    std::unique_ptr<psy::C::Type,std::default_delete<psy::C::Type>>::
    unique_ptr<psy::C::ArrayType,std::default_delete<psy::C::ArrayType>,void>
              ((unique_ptr<psy::C::Type,std::default_delete<psy::C::Type>> *)&local_90,&local_98);
    pTVar4 = SemanticModel::keepType(pSVar1,&local_90);
    this->ty_ = pTVar4;
    std::unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_>::~unique_ptr(&local_90);
    std::unique_ptr<psy::C::ArrayType,_std::default_delete<psy::C::ArrayType>_>::~unique_ptr
              (&local_98);
    std::unique_ptr<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_>::~unique_ptr
              ((unique_ptr<psy::C::QualifiedType,_std::default_delete<psy::C::QualifiedType>_> *)&ty
              );
  }
  else {
    if (3 < (ushort)(SVar2 - Keyword_ExtGNU___printf__)) {
      poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x291);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,"<empty message>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      return Quit;
    }
    pCVar3 = SemanticModel::compilation(this->semaModel_);
    pTVar4 = &Compilation::canonicalBasicType(pCVar3,Int_S)->super_Type;
    this->ty_ = pTVar4;
  }
  return Skip;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitPredefinedName(
        const PredefinedNameSyntax* node)
{
    switch (node->identifierToken().kind()) {
        case SyntaxKind::Keyword___func__:
        case SyntaxKind::Keyword_ExtGNU___FUNCTION__:
        case SyntaxKind::Keyword_ExtGNU___PRETTY_FUNCTION__: {
            auto charTy = semaModel_->compilation()->canonicalBasicType(BasicTypeKind::Char);
            std::unique_ptr<QualifiedType> qualTy(new QualifiedType(charTy));
            qualTy->qualifyWithConst();
            auto ty = semaModel_->keepType(std::move(qualTy));
            ty_ = semaModel_->keepType(std::unique_ptr<ArrayType>(new ArrayType(ty)));
            break;
        }
        case SyntaxKind::Keyword_ExtGNU___printf__:
        case SyntaxKind::Keyword_ExtGNU___scanf__:
        case SyntaxKind::Keyword_ExtGNU___strftime__:
        case SyntaxKind::Keyword_ExtGNU___strfmon__:
            ty_ = semaModel_->compilation()->canonicalBasicType(BasicTypeKind::Int_S);
            break;
        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }

    return Action::Skip;
}